

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcFunc.c
# Opt level: O1

char * Abc_ConvertBddToSop(Mem_Flex_t *pMan,DdManager *dd,DdNode *bFuncOn,DdNode *bFuncOnDc,
                          int nFanins,int fAllPrimes,Vec_Str_t *vCube,int fMode)

{
  int iVar1;
  uint uVar2;
  int iVar3;
  char *pcVar4;
  DdNode *pDVar5;
  char *pcVar6;
  long lVar7;
  int fPhase;
  size_t __size;
  DdNode *zCover0;
  DdNode *zCover1;
  int nCubes_3;
  undefined8 local_58;
  undefined8 local_50;
  int local_44;
  DdNode *local_40;
  int local_34;
  
  if ((bFuncOn != bFuncOnDc) && (iVar3 = Cudd_bddLeq(dd,bFuncOn,bFuncOnDc), iVar3 == 0)) {
    __assert_fail("bFuncOn == bFuncOnDc || Cudd_bddLeq( dd, bFuncOn, bFuncOnDc )",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abc/abcFunc.c"
                  ,0xdd,
                  "char *Abc_ConvertBddToSop(Mem_Flex_t *, DdManager *, DdNode *, DdNode *, int, int, Vec_Str_t *, int)"
                 );
  }
  if ((*(int *)((ulong)bFuncOn & 0xfffffffffffffffe) == 0x7fffffff) ||
     (*(int *)((ulong)bFuncOnDc & 0xfffffffffffffffe) == 0x7fffffff)) {
    if (pMan == (Mem_Flex_t *)0x0) {
      pcVar4 = (char *)malloc((long)(nFanins + 4));
    }
    else {
      pcVar4 = Mem_FlexEntryFetch(pMan,nFanins + 4);
    }
    *pcVar4 = ' ';
    pDVar5 = Cudd_ReadOne(dd);
    pcVar4[1] = pDVar5 == bFuncOn | 0x30;
    pcVar4[2] = '\n';
    pcVar4[3] = '\0';
    return pcVar4;
  }
  if (fMode == 1) {
    if (fAllPrimes == 0) {
      pDVar5 = Cudd_zddIsop(dd,bFuncOn,bFuncOnDc,(DdNode **)&local_58);
      Cudd_Ref(local_58);
      Cudd_Ref(pDVar5);
      Cudd_RecursiveDeref(dd,pDVar5);
    }
    else {
      local_58 = Extra_zddPrimes(dd,bFuncOnDc);
      Cudd_Ref(local_58);
    }
    local_50._0_4_ = 0;
    Abc_CountZddCubes_rec(dd,local_58,(int *)&local_50);
    iVar3 = (int)local_50;
LAB_00855771:
    fPhase = 1;
  }
  else if (fMode == 0) {
    if (fAllPrimes == 0) {
      pDVar5 = Cudd_zddIsop(dd,(DdNode *)((ulong)bFuncOnDc ^ 1),(DdNode *)((ulong)bFuncOn ^ 1),
                            (DdNode **)&local_58);
      Cudd_Ref(local_58);
      Cudd_Ref(pDVar5);
      Cudd_RecursiveDeref(dd,pDVar5);
    }
    else {
      local_58 = Extra_zddPrimes(dd,(DdNode *)((ulong)bFuncOnDc ^ 1));
      Cudd_Ref(local_58);
    }
    local_50._0_4_ = 0;
    Abc_CountZddCubes_rec(dd,local_58,(int *)&local_50);
    fPhase = 0;
    iVar3 = (int)local_50;
  }
  else {
    if (fMode != -1) {
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abc/abcFunc.c"
                    ,0x133,
                    "char *Abc_ConvertBddToSop(Mem_Flex_t *, DdManager *, DdNode *, DdNode *, int, int, Vec_Str_t *, int)"
                   );
    }
    if (fAllPrimes != 0) {
      __assert_fail("fAllPrimes == 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abc/abcFunc.c"
                    ,0xed,
                    "char *Abc_ConvertBddToSop(Mem_Flex_t *, DdManager *, DdNode *, DdNode *, int, int, Vec_Str_t *, int)"
                   );
    }
    pDVar5 = Cudd_zddIsop(dd,(DdNode *)((ulong)bFuncOnDc ^ 1),(DdNode *)((ulong)bFuncOn ^ 1),
                          (DdNode **)&local_50);
    Cudd_Ref((DdNode *)CONCAT44(local_50._4_4_,(int)local_50));
    Cudd_Ref(pDVar5);
    Cudd_RecursiveDeref(dd,pDVar5);
    local_58._0_4_ = 0;
    Abc_CountZddCubes_rec(dd,(DdNode *)CONCAT44(local_50._4_4_,(int)local_50),(int *)&local_58);
    local_44 = (int)local_58;
    pDVar5 = Cudd_zddIsop(dd,bFuncOn,bFuncOnDc,&local_40);
    Cudd_Ref(local_40);
    Cudd_Ref(pDVar5);
    Cudd_RecursiveDeref(dd,pDVar5);
    local_58 = (DdNode *)((ulong)local_58._4_4_ << 0x20);
    fPhase = 0;
    Abc_CountZddCubes_rec(dd,local_40,(int *)&local_58);
    iVar1 = local_44;
    iVar3 = (int)local_58;
    if ((int)local_58 <= local_44) {
      local_58 = local_40;
      Cudd_RecursiveDerefZdd(dd,(DdNode *)CONCAT44(local_50._4_4_,(int)local_50));
      goto LAB_00855771;
    }
    local_58 = (DdNode *)CONCAT44(local_50._4_4_,(int)local_50);
    Cudd_RecursiveDerefZdd(dd,local_40);
    iVar3 = iVar1;
  }
  if (100000 < iVar3) {
    Cudd_RecursiveDerefZdd(dd,local_58);
    printf("The number of cubes exceeded the predefined limit (%d).\n",100000);
    return (char *)0x0;
  }
  iVar3 = iVar3 * (nFanins + 3);
  iVar1 = iVar3 + 1;
  if (pMan == (Mem_Flex_t *)0x0) {
    pcVar4 = (char *)malloc((long)iVar1);
  }
  else {
    pcVar4 = Mem_FlexEntryFetch(pMan,iVar1);
  }
  pcVar4[iVar3] = '\0';
  if (vCube->nCap < nFanins) {
    if (vCube->pArray == (char *)0x0) {
      pcVar6 = (char *)malloc((long)nFanins);
    }
    else {
      pcVar6 = (char *)realloc(vCube->pArray,(long)nFanins);
    }
    vCube->pArray = pcVar6;
    vCube->nCap = nFanins;
  }
  vCube->nSize = nFanins;
  if (0 < nFanins) {
    lVar7 = 0;
    do {
      vCube->pArray[lVar7] = '-';
      lVar7 = lVar7 + 1;
    } while (lVar7 < vCube->nSize);
  }
  uVar2 = vCube->nCap;
  if (vCube->nSize == uVar2) {
    if ((int)uVar2 < 0x10) {
      if (vCube->pArray == (char *)0x0) {
        pcVar6 = (char *)malloc(0x10);
      }
      else {
        pcVar6 = (char *)realloc(vCube->pArray,0x10);
      }
      vCube->pArray = pcVar6;
      __size = 0x10;
    }
    else {
      __size = (ulong)uVar2 * 2;
      if ((int)__size <= (int)uVar2) goto LAB_00855895;
      if (vCube->pArray == (char *)0x0) {
        pcVar6 = (char *)malloc(__size);
      }
      else {
        pcVar6 = (char *)realloc(vCube->pArray,__size);
      }
      vCube->pArray = pcVar6;
    }
    vCube->nCap = (int)__size;
  }
LAB_00855895:
  iVar3 = vCube->nSize;
  vCube->nSize = iVar3 + 1;
  vCube->pArray[iVar3] = '\0';
  local_34 = 0;
  Abc_ConvertZddToSop_rec(dd,local_58,pcVar4,nFanins,vCube,fPhase,&local_34);
  Cudd_RecursiveDerefZdd(dd,local_58);
  return pcVar4;
}

Assistant:

char * Abc_ConvertBddToSop( Mem_Flex_t * pMan, DdManager * dd, DdNode * bFuncOn, DdNode * bFuncOnDc, int nFanins, int fAllPrimes, Vec_Str_t * vCube, int fMode )
{
    int fVerify = 0;
    char * pSop;
    DdNode * bFuncNew, * bCover, * zCover, * zCover0, * zCover1;
    int nCubes = 0, nCubes0, nCubes1, fPhase = 0;

    assert( bFuncOn == bFuncOnDc || Cudd_bddLeq( dd, bFuncOn, bFuncOnDc ) );
    if ( Cudd_IsConstant(bFuncOn) || Cudd_IsConstant(bFuncOnDc) )
    {
        if ( pMan )
            pSop = Mem_FlexEntryFetch( pMan, nFanins + 4 );
        else
            pSop = ABC_ALLOC( char, nFanins + 4 );
        pSop[0] = ' ';
        pSop[1] = '0' + (int)(bFuncOn == Cudd_ReadOne(dd));
        pSop[2] = '\n';
        pSop[3] = '\0';
        return pSop;
    }

    if ( fMode == -1 )
    { // try both phases
        assert( fAllPrimes == 0 );

        // get the ZDD of the negative polarity
        bCover = Cudd_zddIsop( dd, Cudd_Not(bFuncOnDc), Cudd_Not(bFuncOn), &zCover0 );
        Cudd_Ref( zCover0 );
        Cudd_Ref( bCover );
        Cudd_RecursiveDeref( dd, bCover );
        nCubes0 = Abc_CountZddCubes( dd, zCover0 );

        // get the ZDD of the positive polarity
        bCover = Cudd_zddIsop( dd, bFuncOn, bFuncOnDc, &zCover1 );
        Cudd_Ref( zCover1 );
        Cudd_Ref( bCover );
        Cudd_RecursiveDeref( dd, bCover );
        nCubes1 = Abc_CountZddCubes( dd, zCover1 );

        // compare the number of cubes
        if ( nCubes1 <= nCubes0 )
        { // use positive polarity
            nCubes = nCubes1;
            zCover = zCover1;
            Cudd_RecursiveDerefZdd( dd, zCover0 );
            fPhase = 1;
        }
        else
        { // use negative polarity
            nCubes = nCubes0;
            zCover = zCover0;
            Cudd_RecursiveDerefZdd( dd, zCover1 );
            fPhase = 0;
        }
    }
    else if ( fMode == 0 )
    {
        // get the ZDD of the negative polarity
        if ( fAllPrimes )
        {
            zCover = Extra_zddPrimes( dd, Cudd_Not(bFuncOnDc) ); 
            Cudd_Ref( zCover );
        }
        else
        {
            bCover = Cudd_zddIsop( dd, Cudd_Not(bFuncOnDc), Cudd_Not(bFuncOn), &zCover );
            Cudd_Ref( zCover );
            Cudd_Ref( bCover );
            Cudd_RecursiveDeref( dd, bCover );
        }
        nCubes = Abc_CountZddCubes( dd, zCover );
        fPhase = 0;
    }
    else if ( fMode == 1 )
    {
        // get the ZDD of the positive polarity
        if ( fAllPrimes )
        {
            zCover = Extra_zddPrimes( dd, bFuncOnDc ); 
            Cudd_Ref( zCover );
        }
        else
        {
            bCover = Cudd_zddIsop( dd, bFuncOn, bFuncOnDc, &zCover );
            Cudd_Ref( zCover );
            Cudd_Ref( bCover );
            Cudd_RecursiveDeref( dd, bCover );
        }
        nCubes = Abc_CountZddCubes( dd, zCover );
        fPhase = 1;
    }
    else
    {
        assert( 0 );
    }

    if ( nCubes > ABC_MAX_CUBES )
    {
        Cudd_RecursiveDerefZdd( dd, zCover );
        printf( "The number of cubes exceeded the predefined limit (%d).\n", ABC_MAX_CUBES );
        return NULL;
    }

    // allocate memory for the cover
    if ( pMan )
        pSop = Mem_FlexEntryFetch( pMan, (nFanins + 3) * nCubes + 1 );
    else 
        pSop = ABC_ALLOC( char, (nFanins + 3) * nCubes + 1 );
    pSop[(nFanins + 3) * nCubes] = 0;
    // create the SOP
    Vec_StrFill( vCube, nFanins, '-' );
    Vec_StrPush( vCube, '\0' );
    Abc_ConvertZddToSop( dd, zCover, pSop, nFanins, vCube, fPhase );
    Cudd_RecursiveDerefZdd( dd, zCover );

    // verify
    if ( fVerify )
    {
        bFuncNew = Abc_ConvertSopToBdd( dd, pSop, NULL );  Cudd_Ref( bFuncNew );
        if ( bFuncOn == bFuncOnDc )
        {
            if ( bFuncNew != bFuncOn )
                printf( "Verification failed.\n" );
        }
        else
        {
            if ( !Cudd_bddLeq(dd, bFuncOn, bFuncNew) || !Cudd_bddLeq(dd, bFuncNew, bFuncOnDc) )
                printf( "Verification failed.\n" );
        }
        Cudd_RecursiveDeref( dd, bFuncNew );
    }
    return pSop;
}